

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

void __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::getIterationData
          (InputVariablesCannotBeModifiedTest *this,_test_iteration iteration,
          ApiType *out_required_min_context_type_ptr,_shader_stage *out_target_shader_stage_ptr,
          string *out_body_ptr)

{
  TestError *this_00;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  stringstream body_sstream;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  switch(iteration) {
  case TEST_ITERATION_FIRST:
    out_required_min_context_type_ptr->m_bits = 0x113;
    *out_target_shader_stage_ptr = SHADER_STAGE_FRAGMENT;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 140\n\nin  vec4 data;\nout vec4 result;\n\nvoid main()\n{\n    data   += vec4(1.0);\n    result  = data;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_FRAGMENT;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nin inputBlock\n{\n    vec4 data;\n};\n\nout vec4 result;\n\nvoid main()\n{\n    data   += vec4(1.0);\n    result  = data;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x113;
    *out_target_shader_stage_ptr = SHADER_STAGE_FRAGMENT;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 140\n\nin  vec4 data;\nout vec4 result;\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    result = data;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x113;
    *out_target_shader_stage_ptr = SHADER_STAGE_FRAGMENT;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 140\n\nin  vec4 data;\nout vec4 result;\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    result = data;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE:
    out_required_min_context_type_ptr->m_bits = 0x123;
    *out_target_shader_stage_ptr = SHADER_STAGE_GEOMETRY;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 150\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin vec4 data[];\n\nvoid main()\n{\n    data[0]     += vec4(1.0);\n    gl_Position  = data[0];\n\n    EmitVertex();\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_IN_INPUT_BLOCK:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_GEOMETRY;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin inputBlock\n{\n    vec4 data[];\n};\n\nvoid main()\n{\n    data[0]     += vec4(1.0);\n    gl_Position  = data[0];\n\n    EmitVertex();\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x123;
    *out_target_shader_stage_ptr = SHADER_STAGE_GEOMETRY;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 150\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin vec4 data[];\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position = data[0];\n\n    EmitVertex();\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x123;
    *out_target_shader_stage_ptr = SHADER_STAGE_GEOMETRY;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 150\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\nin vec4 data[];\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position = data[0];\n\n    EmitVertex();\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_CONTROL;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(vertices = 4) out;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid main()\n{\n    data[0] += vec4(1.0);\n    result   = data[0];\n\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_IN_INPUT_BLOCK:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_CONTROL;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(vertices = 4) out;\n\nin inputBlock\n{\n    vec4 data;\n} inData[];\n\npatch out vec4 result[];\n\nvoid main()\n{\n    inData[0].data          += vec4(1.0);\n    result[gl_InvocationID]  = inData[0].data;\n\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_CONTROL;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(vertices = 4) out;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    result = data[0];\n\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_CONTROL;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(vertices = 4) out;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    result = data[0];\n\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_TE_PATCH_VARIABLE:
  case TEST_ITERATION_INPUT_TE_VARIABLE:
    std::__cxx11::stringstream::stringstream(local_1a8);
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_EVALUATION;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"#version 400\n\nlayout(triangles) in;\n\n",0x25);
    pcVar3 = glcts::fixed_sample_locations_values + 1;
    if (iteration == TEST_ITERATION_INPUT_TE_PATCH_VARIABLE) {
      pcVar3 = "patch ";
    }
    lVar2 = 6;
    if (iteration != TEST_ITERATION_INPUT_TE_PATCH_VARIABLE) {
      lVar2 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,lVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"in  vec4 data[];\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "      out vec4 result;\n\nvoid main()\n{\n    data[0]     += vec4(1.0);\n    gl_Position  = data[0];\n}\n"
               ,0x62);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)out_body_ptr,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    return;
  case TEST_ITERATION_INPUT_TE_VARIABLE_IN_INPUT_BLOCK:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_EVALUATION;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(triangles) in;\n\nin inputBlock\n{\n    vec4 data;\n} inData[];\n\nvoid main()\n{\n    inData[0].data += vec4(1.0);\n    gl_Position     = inData[0].data;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_EVALUATION;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(triangles) in;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(inout vec4 arg)\n{\n    arg += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position  = data[0];\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x104;
    *out_target_shader_stage_ptr = SHADER_STAGE_TESSELLATION_EVALUATION;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 400\n\nlayout(triangles) in;\n\nin  vec4 data[];\nout vec4 result;\n\nvoid testFunc(out vec4 arg)\n{\n    arg = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data[0]);\n\n    gl_Position = data[0];\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE:
    out_required_min_context_type_ptr->m_bits = 0x113;
    *out_target_shader_stage_ptr = SHADER_STAGE_VERTEX;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 140\n\nin vec4 data;\n\nvoid main()\n{\n    data        += vec4(1.0);\n    gl_Position  = data;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x113;
    *out_target_shader_stage_ptr = SHADER_STAGE_VERTEX;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 140\n\nin vec4 data;\n\nvoid testFunc(inout vec4 argument)\n{\n    argument += vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    gl_Position = data;\n}\n"
    ;
    break;
  case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
    out_required_min_context_type_ptr->m_bits = 0x113;
    *out_target_shader_stage_ptr = SHADER_STAGE_VERTEX;
    pcVar3 = (char *)out_body_ptr->_M_string_length;
    pcVar1 = 
    "#version 140\n\nin vec4 data;\n\nvoid testFunc(out vec4 argument)\n{\n    argument = vec4(1.0);\n}\n\nvoid main()\n{\n    testFunc(data);\n\n    gl_Position = data;\n}\n"
    ;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized test iteration type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
               ,0x363);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_replace((ulong)out_body_ptr,0,pcVar3,(ulong)pcVar1);
  return;
}

Assistant:

void InputVariablesCannotBeModifiedTest::getIterationData(_test_iteration iteration,
														  glu::ApiType*   out_required_min_context_type_ptr,
														  _shader_stage*  out_target_shader_stage_ptr,
														  std::string*	out_body_ptr) const
{
	switch (iteration)
	{
	case TEST_ITERATION_INPUT_FS_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in  vec4 data;\n"
						"out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data   += vec4(1.0);\n"
						"    result  = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 400\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data;\n"
						"};\n"
						"\n"
						"out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data   += vec4(1.0);\n"
						"    result  = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in  vec4 data;\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    result = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_FS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_FRAGMENT;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in  vec4 data;\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    result = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 2);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 150\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in vec4 data[];\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0]     += vec4(1.0);\n"
						"    gl_Position  = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data[];\n"
						"};\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0]     += vec4(1.0);\n"
						"    gl_Position  = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 2);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 150\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in vec4 data[];\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_GS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 2);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_GEOMETRY;

		*out_body_ptr = "#version 150\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(points, max_vertices = 1) out;\n"
						"\n"
						"in vec4 data[];\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position = data[0];\n"
						"\n"
						"    EmitVertex();\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0] += vec4(1.0);\n"
						"    result   = data[0];\n"
						"\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data;\n"
						"} inData[];\n"
						"\n"
						"patch out vec4 result[];\n"
						"\n"
						"void main()\n"
						"{\n"
						"    inData[0].data          += vec4(1.0);\n"
						"    result[gl_InvocationID]  = inData[0].data;\n"
						"\n"
						"    gl_TessLevelInner[0] = 1.0;\n"
						"    gl_TessLevelInner[1] = 1.0;\n"
						"    gl_TessLevelOuter[0] = 1.0;\n"
						"    gl_TessLevelOuter[1] = 1.0;\n"
						"    gl_TessLevelOuter[2] = 1.0;\n"
						"    gl_TessLevelOuter[3] = 1.0;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    result = data[0];\n"
						"\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TC_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_CONTROL;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(vertices = 4) out;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    result = data[0];\n"
						"\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TE_PATCH_VARIABLE:
	case TEST_ITERATION_INPUT_TE_VARIABLE:
	{
		std::stringstream body_sstream;

		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		body_sstream << "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
					 << ((iteration == TEST_ITERATION_INPUT_TE_PATCH_VARIABLE) ? "patch " : "") << "in  vec4 data[];\n"
					 << "      out vec4 result;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data[0]     += vec4(1.0);\n"
						"    gl_Position  = data[0];\n"
						"}\n";

		*out_body_ptr = body_sstream.str();
		break;
	}

	case TEST_ITERATION_INPUT_TE_VARIABLE_IN_INPUT_BLOCK:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
						"in inputBlock\n"
						"{\n"
						"    vec4 data;\n"
						"} inData[];\n"
						"\n"
						"void main()\n"
						"{\n"
						"    inData[0].data += vec4(1.0);\n"
						"    gl_Position     = inData[0].data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(inout vec4 arg)\n"
						"{\n"
						"    arg += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position  = data[0];\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_TE_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(4, 0);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_TESSELLATION_EVALUATION;

		*out_body_ptr = "#version 400\n"
						"\n"
						"layout(triangles) in;\n"
						"\n"
						"in  vec4 data[];\n"
						"out vec4 result;\n"
						"\n"
						"void testFunc(out vec4 arg)\n"
						"{\n"
						"    arg = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data[0]);\n"
						"\n"
						"    gl_Position = data[0];\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_VS_VARIABLE:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_VERTEX;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in vec4 data;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    data        += vec4(1.0);\n"
						"    gl_Position  = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_INOUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_VERTEX;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in vec4 data;\n"
						"\n"
						"void testFunc(inout vec4 argument)\n"
						"{\n"
						"    argument += vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    gl_Position = data;\n"
						"}\n";

		break;
	}

	case TEST_ITERATION_INPUT_VS_VARIABLE_PASSED_TO_OUT_FUNCTION_PARAMETER:
	{
		*out_required_min_context_type_ptr = glu::ApiType::core(3, 1);
		*out_target_shader_stage_ptr	   = SHADER_STAGE_VERTEX;

		*out_body_ptr = "#version 140\n"
						"\n"
						"in vec4 data;\n"
						"\n"
						"void testFunc(out vec4 argument)\n"
						"{\n"
						"    argument = vec4(1.0);\n"
						"}\n"
						"\n"
						"void main()\n"
						"{\n"
						"    testFunc(data);\n"
						"\n"
						"    gl_Position = data;\n"
						"}\n";

		break;
	}

	default:
		TCU_FAIL("Unrecognized test iteration type");
	} /* switch (iteration) */
}